

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::LeastFun::GetFunctions(void)

{
  ScalarFunctionSet *in_RDI;
  ScalarFunction SStack_138;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  GetLeastGreatestFunction<duckdb::LeastOp>();
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &SStack_138);
  ScalarFunction::~ScalarFunction(&SStack_138);
  return in_RDI;
}

Assistant:

ScalarFunctionSet LeastFun::GetFunctions() {
	return GetLeastGreatestFunctions<LeastOp>();
}